

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

int __thiscall chatter::Protocol::connect(Protocol *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint64_t uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __n;
  undefined4 in_register_00000034;
  int in_R8D;
  bool bVar3;
  shared_ptr<chatter::Packet> local_50 [2];
  undefined1 local_30 [8];
  ptr p;
  Peer *peer_local;
  Protocol *this_local;
  
  p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000034,__fd);
  bVar3 = *(int *)&(p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base == 0;
  if (bVar3) {
    *(undefined4 *)
     &(p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = 1;
    uVar1 = Host::timestamp_now(this->m_host);
    p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = (int)uVar1;
    p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_weak_count = (int)(uVar1 >> 0x20);
    Packet::create((int)(__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30,'\0');
    __n = p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    peVar2 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    peVar2->m_peer = (Peer *)__n._M_pi;
    peVar2 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    Packet::set_type(peVar2,CONNECT_REQUEST);
    peVar2 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    Packet::set_flag(peVar2,RELIABLE);
    std::shared_ptr<chatter::Packet>::shared_ptr(local_50,(shared_ptr<chatter::Packet> *)local_30);
    send(this,(int)local_50,(void *)0x1,(size_t)__n._M_pi,in_R8D);
    std::shared_ptr<chatter::Packet>::~shared_ptr(local_50);
    std::shared_ptr<chatter::Packet>::~shared_ptr((shared_ptr<chatter::Packet> *)local_30);
    p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)p.
                                     super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi >> 8),bVar3);
}

Assistant:

bool Protocol::connect(Peer* peer)
{
    if (peer->m_state != PeerState::DISCONNECTED)
        return false;

    peer->m_state = PeerState::CONNECTION_REQUESTED;
    peer->m_connect_ts = m_host->timestamp_now();

    auto p = Packet::create();
    p->m_peer = peer;
    p->set_type(PacketType::CONNECT_REQUEST);
    p->set_flag(PacketFlag::RELIABLE);

    send(p, true);

    return true;
}